

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

LY_ERR lyds_create_metadata(lyd_node *leader,lyd_meta **meta_p)

{
  int iVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  LY_ERR ret__;
  lys_module *plVar4;
  lyd_meta *meta;
  uint32_t i;
  
  if ((leader == (lyd_node *)0x0) ||
     ((leader->prev->next != (lyd_node *)0x0 && (leader->schema == leader->prev->schema)))) {
    __assert_fail("leader && (!leader->prev->next || (leader->schema != leader->prev->schema))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x486,"LY_ERR lyds_create_metadata(struct lyd_node *, struct lyd_meta **)");
  }
  lyds_get_rb_tree(leader,&meta);
  LVar2 = LY_SUCCESS;
  if (meta == (lyd_meta *)0x0) {
    i = 0;
    plVar4 = (lys_module *)&leader[2].schema;
    do {
      plVar3 = plVar4;
      if (leader->schema != (lysc_node *)0x0) {
        plVar3 = leader->schema->module;
      }
      plVar3 = ly_ctx_get_module_iter(plVar3->ctx,&i);
      if (plVar3 == (lys_module *)0x0) {
        if (leader->schema != (lysc_node *)0x0) {
          plVar4 = leader->schema->module;
        }
        ly_log(plVar4->ctx,LY_LLERR,LY_EINT,"The yang module is not installed.");
        return LY_EINT;
      }
      iVar1 = strcmp(plVar3->name,"yang");
    } while (iVar1 != 0);
    LVar2 = lyd_create_meta(leader,&meta,plVar3,"lyds_tree",9,(char *)0x0,0,'\0','\x01',
                            (ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,0x3f3,(lysc_node *)0x0,'\0',
                            (ly_bool *)0x0);
    if (LVar2 == LY_SUCCESS) {
      if (meta_p != (lyd_meta **)0x0) {
        *meta_p = meta;
      }
      LVar2 = LY_SUCCESS;
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
lyds_create_metadata(struct lyd_node *leader, struct lyd_meta **meta_p)
{
    LY_ERR ret;
    uint32_t i;
    struct lyd_meta *meta;
    struct lys_module *modyang;

    assert(leader && (!leader->prev->next || (leader->schema != leader->prev->schema)));

    lyds_get_rb_tree(leader, &meta);
    if (meta) {
        /* nothing to do, the metadata is already set */
        return LY_SUCCESS;
    }

    /* Check that the 'yang' module is defined. */
    i = 0;
    while ((modyang = ly_ctx_get_module_iter(LYD_CTX(leader), &i))) {
        if (!strcmp(modyang->name, "yang")) {
            break;
        }
    }
    LY_CHECK_ERR_RET(!modyang, LOGERR(LYD_CTX(leader), LY_EINT, "The yang module is not installed."), LY_EINT);

    /* create new metadata, its rbt is NULL */
    ret = lyd_create_meta(leader, &meta, modyang, "lyds_tree", 9, NULL, 0, 0, 1, NULL,
            LY_VALUE_CANON, NULL, LYD_HINT_DATA, NULL, 0, NULL);
    LY_CHECK_RET(ret);

    if (meta_p) {
        *meta_p = meta;
    }

    return LY_SUCCESS;
}